

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

int __thiscall trackerboy::Player::progressMax(Player *this)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  anon_class_1_0_00000001 local_1;
  
  lVar2 = (long)(char)*(__index_type *)
                       ((long)&(this->mContext).
                               super__Variant_base<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                               .
                               super__Move_assign_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                               .
                               super__Copy_assign_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                               .
                               super__Move_ctor_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                               .
                               super__Copy_ctor_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                               .
                               super__Variant_storage_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                       + 0x28);
  if (lVar2 != -1) {
    iVar1 = (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__deduce_visit_result<int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/build_O3/_deps/libtrackerboy-src/src/export/Player.cpp:90:23)_&&,_const_std::variant<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>_&>
              ::_S_vtable._M_arr[lVar2]._M_data)(&local_1,&this->mContext);
    return iVar1;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar3 = &PTR__exception_002012c8;
  puVar3[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar3,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

int Player::progressMax() const {
    return std::visit([](auto&& ctx) {
        using T = std::decay_t<decltype(ctx)>;

        if constexpr (std::is_same_v<T, LoopContext>) {
            return ctx.loopAmount;
        } else if constexpr (std::is_same_v<T, DurationContext>) {
            return ctx.framesToPlay;
        } else {
            return 0;
        }
    }, mContext);
}